

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

void __thiscall pbrt::RGBSpectrum::RGBSpectrum(RGBSpectrum *this,RGBColorSpace *cs,RGB *rgb)

{
  undefined8 uVar1;
  float fVar2;
  undefined1 auVar5 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  Float FVar6;
  initializer_list<float> __l;
  RGB RVar7;
  RGBSigmoidPolynomial RVar8;
  RGB local_28;
  
  (this->rgb).b = rgb->b;
  FVar6 = rgb->g;
  (this->rgb).r = rgb->r;
  (this->rgb).g = FVar6;
  this->illuminant = &cs->illuminant;
  local_28.r = rgb->r;
  local_28.g = rgb->g;
  local_28.b = rgb->b;
  __l._M_len = 3;
  __l._M_array = &local_28.r;
  fVar2 = std::max<float>(__l);
  fVar2 = fVar2 + fVar2;
  auVar5 = (undefined1  [56])0x0;
  FVar6 = 0.0;
  this->scale = fVar2;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    RVar7 = RGB::operator/(rgb,fVar2);
    FVar6 = RVar7.b;
    auVar3._0_8_ = RVar7._0_8_;
    auVar3._8_56_ = auVar5;
  }
  else {
    auVar3 = ZEXT1264(ZEXT812(0));
  }
  auVar5 = auVar3._8_56_;
  local_28._0_8_ = vmovlps_avx(auVar3._0_16_);
  local_28.b = FVar6;
  RVar8 = RGBColorSpace::ToRGBCoeffs(cs,&local_28);
  auVar4._0_8_ = RVar8._0_8_;
  auVar4._8_56_ = auVar5;
  uVar1 = vmovlps_avx(auVar4._0_16_);
  (this->rsp).c0 = (Float)(int)uVar1;
  (this->rsp).c1 = (Float)(int)((ulong)uVar1 >> 0x20);
  (this->rsp).c2 = RVar8.c2;
  return;
}

Assistant:

RGBSpectrum::RGBSpectrum(const RGBColorSpace &cs, const RGB &rgb)
    : rgb(rgb), illuminant(&cs.illuminant) {
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    scale = 2 * m;
    rsp = cs.ToRGBCoeffs(scale ? rgb / scale : RGB(0, 0, 0));
}